

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::Runner::runTests(Totals *__return_storage_ptr__,Runner *this)

{
  bool bVar1;
  int iVar2;
  Config *pCVar3;
  undefined4 extraout_var;
  ITagAliasRegistry *tagAliases;
  TestSpecParser *this_00;
  IRegistryHub *pIVar4;
  undefined4 extraout_var_00;
  reference pTVar5;
  pair<std::_Rb_tree_const_iterator<Catch::TestCase>,_bool> pVar6;
  allocator local_431;
  string local_430 [32];
  _Base_ptr local_410;
  undefined1 local_408;
  Totals local_400;
  _Self local_3d0;
  _Self local_3c8;
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_3c0;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_3b8;
  const_iterator itEnd;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_3a8;
  const_iterator it;
  undefined1 local_398 [4];
  int testsRunForGroup;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> testCases;
  string local_378 [32];
  TestSpecParser local_358;
  TestSpec local_2e8;
  undefined1 local_2d0 [8];
  TestSpec testSpec;
  string local_2b0 [48];
  Ptr<const_Catch::IConfig> local_280;
  undefined1 local_278 [8];
  RunContext context;
  Runner *this_local;
  
  context.m_unfinishedSections.
  super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  pCVar3 = Ptr<Catch::Config>::get(&this->m_config);
  Ptr<const_Catch::IConfig>::Ptr(&local_280,(IConfig *)pCVar3);
  RunContext::RunContext((RunContext *)local_278,&local_280,&this->m_reporter);
  Ptr<const_Catch::IConfig>::~Ptr(&local_280);
  Totals::Totals(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2b0,"",
             (allocator *)
             ((long)&testSpec.m_filters.
                     super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  RunContext::testGroupStarting((RunContext *)local_278,(string *)local_2b0,1,1);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&testSpec.m_filters.
                     super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pCVar3 = Ptr<Catch::Config>::operator->(&this->m_config);
  iVar2 = (*(pCVar3->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  TestSpec::TestSpec((TestSpec *)local_2d0,(TestSpec *)CONCAT44(extraout_var,iVar2));
  bVar1 = TestSpec::hasFilters((TestSpec *)local_2d0);
  if (!bVar1) {
    tagAliases = ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser(&local_358,tagAliases);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_378,"~[.]",
               (allocator *)
               ((long)&testCases.
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    this_00 = TestSpecParser::parse(&local_358,(string *)local_378);
    TestSpecParser::testSpec(&local_2e8,this_00);
    TestSpec::operator=((TestSpec *)local_2d0,&local_2e8);
    TestSpec::~TestSpec(&local_2e8);
    std::__cxx11::string::~string(local_378);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testCases.
                       super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    TestSpecParser::~TestSpecParser(&local_358);
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_398);
  pIVar4 = getRegistryHub();
  iVar2 = (*pIVar4->_vptr_IRegistryHub[3])();
  pCVar3 = Ptr<Catch::Config>::operator*(&this->m_config);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))
            ((long *)CONCAT44(extraout_var_00,iVar2),local_2d0,pCVar3,local_398);
  it._M_current._4_4_ = 0;
  itEnd._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_398);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
              *)&local_3a8,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)&itEnd);
  local_3c0._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_398);
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
              *)&local_3b8,&local_3c0);
  while (bVar1 = __gnu_cxx::operator!=(&local_3a8,&local_3b8), bVar1) {
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
    pTVar5 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator*(&local_3a8);
    local_3c8._M_node =
         (_Base_ptr)
         std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
         find(&this->m_testsAlreadyRun,pTVar5);
    local_3d0._M_node =
         (_Base_ptr)
         std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
         end(&this->m_testsAlreadyRun);
    bVar1 = std::operator==(&local_3c8,&local_3d0);
    if (bVar1) {
      bVar1 = RunContext::aborting((RunContext *)local_278);
      if (bVar1) break;
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&local_3a8);
      RunContext::runTest(&local_400,(RunContext *)local_278,pTVar5);
      Totals::operator+=(__return_storage_ptr__,&local_400);
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&local_3a8);
      pVar6 = std::
              set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::
              insert(&this->m_testsAlreadyRun,pTVar5);
      local_410 = (_Base_ptr)pVar6.first._M_node;
      local_408 = pVar6.second;
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_3a8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"",&local_431);
  RunContext::testGroupEnded((RunContext *)local_278,(string *)local_430,__return_storage_ptr__,1,1)
  ;
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_398);
  TestSpec::~TestSpec((TestSpec *)local_2d0);
  RunContext::~RunContext((RunContext *)local_278);
  return __return_storage_ptr__;
}

Assistant:

Totals runTests() {

            RunContext context( m_config.get(), m_reporter );

            Totals totals;

            context.testGroupStarting( "", 1, 1 ); // deprecated?

            TestSpec testSpec = m_config->testSpec();
            if( !testSpec.hasFilters() )
                testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

            std::vector<TestCase> testCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, testCases );

            int testsRunForGroup = 0;
            for( std::vector<TestCase>::const_iterator it = testCases.begin(), itEnd = testCases.end();
                    it != itEnd;
                    ++it ) {
                testsRunForGroup++;
                if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                    if( context.aborting() )
                        break;

                    totals += context.runTest( *it );
                    m_testsAlreadyRun.insert( *it );
                }
            }
            context.testGroupEnded( "", totals, 1, 1 );
            return totals;
        }